

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

void FastPForLib::Simple16<true>::unpack4_2_5_4(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *(byte *)((long)puVar1 + 3) & 0xf;
  puVar2[1] = *puVar1 >> 0x14 & 0xf;
  puVar2[2] = *puVar1 >> 0xf & 0x1f;
  puVar2[3] = *puVar1 >> 10 & 0x1f;
  puVar2[4] = *puVar1 >> 5 & 0x1f;
  puVar2[5] = *puVar1 & 0x1f;
  *in = puVar1 + 1;
  *out = puVar2 + 6;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack4_2_5_4(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 24) & 0x0f;
  pout[1] = (pin[0] >> 20) & 0x0f;

  pout[2] = (pin[0] >> 15) & 0x1f;
  pout[3] = (pin[0] >> 10) & 0x1f;
  pout[4] = (pin[0] >> 5) & 0x1f;
  pout[5] = pin[0] & 0x1f;

  *in = pin + 1;
  *out = pout + 6;
}